

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_hashmap_node * HashmapNewIntNode(jx9_hashmap *pMap,sxi64 iKey,sxu32 nHash,sxu32 nValIdx)

{
  jx9_hashmap_node *pNode;
  sxu32 nValIdx_local;
  sxu32 nHash_local;
  sxi64 iKey_local;
  jx9_hashmap *pMap_local;
  
  pMap_local = (jx9_hashmap *)SyMemBackendPoolAlloc(&pMap->pVm->sAllocator,0x60);
  if (pMap_local == (jx9_hashmap *)0x0) {
    pMap_local = (jx9_hashmap *)0x0;
  }
  else {
    SyZero(pMap_local,0x60);
    pMap_local->pVm = (jx9_vm *)pMap;
    *(undefined4 *)&pMap_local->apBucket = 1;
    *(sxu32 *)((long)&pMap_local->xIntHash + 4) = nHash;
    pMap_local->pFirst = (jx9_hashmap_node *)iKey;
    *(sxu32 *)&pMap_local->xBlobHash = nValIdx;
  }
  return (jx9_hashmap_node *)pMap_local;
}

Assistant:

static jx9_hashmap_node * HashmapNewIntNode(jx9_hashmap *pMap, sxi64 iKey, sxu32 nHash, sxu32 nValIdx)
{
	jx9_hashmap_node *pNode;
	/* Allocate a new node */
	pNode = (jx9_hashmap_node *)SyMemBackendPoolAlloc(&pMap->pVm->sAllocator, sizeof(jx9_hashmap_node));
	if( pNode == 0 ){
		return 0;
	}
	/* Zero the stucture */
	SyZero(pNode, sizeof(jx9_hashmap_node));
	/* Fill in the structure */
	pNode->pMap  = &(*pMap);
	pNode->iType = HASHMAP_INT_NODE;
	pNode->nHash = nHash;
	pNode->xKey.iKey = iKey;
	pNode->nValIdx  = nValIdx;
	return pNode;
}